

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::BaseFileName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string *path;
  FileDescriptor *file_local;
  string *basename;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  path = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
  anon_unknown_0::PathSplit(path,(string *)0x0,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BaseFileName(const FileDescriptor* file) {
  std::string basename;
  PathSplit(file->name(), NULL, &basename);
  return basename;
}